

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

void __thiscall DataSourceBase::DataSourceBase(DataSourceBase *this,string *_path)

{
  string *_path_local;
  DataSourceBase *this_local;
  
  Data::Source::Source(&this->super_Source);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_001a5788;
  std::__cxx11::string::string((string *)&this->path,(string *)_path);
  this->loaded = false;
  std::
  vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  ::vector(&this->animation_table);
  return;
}

Assistant:

DataSourceBase::DataSourceBase(const std::string &_path)
  : path(_path)
  , loaded(false) {
}